

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,ImGuiSliderFlags flags)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 IVar1;
  ImVec2 p_max_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  int iVar4;
  ImU32 fill_col;
  uint uVar5;
  ulong uVar6;
  ImGuiCol idx;
  void *p_clamp_min;
  byte bVar7;
  void *p_clamp_max;
  bool bVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  ImRect frame_bb;
  ImRect total_bb;
  char value_buf [64];
  ImRect local_d0;
  uint local_c0;
  float local_bc;
  void *local_b8;
  void *local_b0;
  undefined1 local_a8 [16];
  ImVec2 local_90;
  ImRect local_88;
  char local_78 [72];
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  local_bc = v_speed;
  local_b8 = p_max;
  local_b0 = p_min;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  local_a8._0_4_ = CalcItemWidth();
  local_a8._4_4_ = extraout_XMM0_Db;
  local_a8._8_4_ = extraout_XMM0_Dc;
  local_a8._12_4_ = extraout_XMM0_Dd;
  IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
  text_baseline_y = (pIVar2->Style).FramePadding.y;
  local_d0.Min.x = (this->DC).CursorPos.x;
  local_d0.Min.y = (this->DC).CursorPos.y;
  local_d0.Max.x = (float)local_a8._0_4_ + local_d0.Min.x;
  local_d0.Max.y = text_baseline_y + text_baseline_y + IVar1.y + local_d0.Min.y;
  local_88.Max.x = 0.0;
  if (0.0 < IVar1.x) {
    local_88.Max.x = (pIVar2->Style).ItemInnerSpacing.x + IVar1.x;
  }
  local_a8._8_4_ = extraout_XMM0_Dc_00;
  local_a8._0_4_ = IVar1.x;
  local_a8._4_4_ = IVar1.y;
  local_a8._12_4_ = extraout_XMM0_Dd_00;
  local_88.Max.x = local_88.Max.x + local_d0.Max.x;
  local_88.Max.y = local_d0.Max.y + 0.0;
  uVar5 = flags & 0x80;
  local_88.Min.x = local_d0.Min.x;
  local_88.Min.y = local_d0.Min.y;
  ItemSize(&local_88,text_baseline_y);
  bVar3 = ItemAdd(&local_88,id,&local_d0,uVar5 * 2 ^ 0x100);
  if (!bVar3) {
    return false;
  }
  if (format == (char *)0x0) {
    format = GDataTypeInfo[data_type].PrintFmt;
  }
  else if ((data_type == 4) && (((*format != '%' || (format[1] != 'd')) || (format[2] != '\0')))) {
    format = PatchFormatStringFloatToInt(format);
  }
  uVar6 = (ulong)id;
  bVar3 = ItemHoverable(&local_d0,id);
  if (uVar5 == 0) {
    if ((GImGui->ActiveId == id) && (GImGui->TempInputId == id)) goto LAB_001461ed;
    bVar7 = *(byte *)((long)&(pIVar2->LastItemData).StatusFlags + 1) & 1;
  }
  else {
    bVar7 = 0;
  }
  if (bVar3) {
    local_c0 = (uint)CONCAT71((int7)(uVar6 >> 8),(pIVar2->IO).MouseClicked[0]);
    bVar8 = (pIVar2->IO).MouseClickedCount[0] == 2;
  }
  else {
    local_c0 = 0;
    bVar8 = false;
  }
  if ((((bVar7 != 0 || (local_c0 & 1) != 0) || bVar8) || (pIVar2->NavActivateId == id)) ||
     (pIVar2->NavActivateInputId == id)) {
    SetActiveID(id,this);
    SetFocusID(id,this);
    FocusWindow(this);
    pIVar2->ActiveIdUsingNavDirMask = 3;
    if (uVar5 != 0) goto LAB_001462fd;
    if (bVar7 != 0) goto LAB_001461ed;
    if ((char)local_c0 == '\0') {
      if (bVar8) goto LAB_001461ed;
    }
    else if (bVar8 || ((pIVar2->IO).KeyCtrl & 1U) != 0) goto LAB_001461ed;
    if (pIVar2->NavActivateInputId == id) goto LAB_001461ed;
  }
  if ((((uVar5 == 0) && ((pIVar2->IO).ConfigDragClickToInputText != false)) &&
      (bVar3 && pIVar2->ActiveId == id)) &&
     (((pIVar2->IO).MouseReleased[0] == true &&
      (bVar8 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), !bVar8)))) {
    pIVar2->NavActivateInputId = id;
    pIVar2->NavActivateId = id;
    pIVar2->NavActivateFlags = 1;
LAB_001461ed:
    p_clamp_min = local_b0;
    p_clamp_max = local_b8;
    if ((flags & 0x10U) == 0) {
      p_clamp_max = (void *)0x0;
      p_clamp_min = (void *)0x0;
    }
    else if (local_b8 != (void *)0x0 && local_b0 != (void *)0x0) {
      iVar4 = DataTypeCompare(data_type,local_b0,local_b8);
      if (-1 < iVar4) {
        p_clamp_max = (void *)0x0;
        p_clamp_min = (void *)0x0;
      }
    }
    bVar3 = TempInputScalar(&local_d0,id,label,data_type,p_data,format,p_clamp_min,p_clamp_max);
    return bVar3;
  }
LAB_001462fd:
  idx = 9;
  if (pIVar2->ActiveId != id) {
    idx = bVar3 + 7;
  }
  fill_col = GetColorU32(idx,1.0);
  RenderNavHighlight(&local_d0,id,1);
  IVar1.y = local_d0.Min.y;
  IVar1.x = local_d0.Min.x;
  p_max_00.y = local_d0.Max.y;
  p_max_00.x = local_d0.Max.x;
  RenderFrame(IVar1,p_max_00,fill_col,true,(pIVar2->Style).FrameRounding);
  bVar3 = DragBehavior(id,data_type,p_data,local_bc,local_b0,local_b8,format,flags);
  if (bVar3) {
    MarkItemEdited(id);
  }
  iVar4 = DataTypeFormatString(local_78,0x40,data_type,p_data,format);
  if (pIVar2->LogEnabled == true) {
    LogSetNextTextDecoration("{","}");
  }
  local_90.x = 0.5;
  local_90.y = 0.5;
  RenderTextClipped(&local_d0.Min,&local_d0.Max,local_78,local_78 + iVar4,(ImVec2 *)0x0,&local_90,
                    (ImRect *)0x0);
  if (0.0 < (float)local_a8._0_4_) {
    pos.y = (pIVar2->Style).FramePadding.y + local_d0.Min.y;
    pos.x = (pIVar2->Style).ItemInnerSpacing.x + local_d0.Max.x;
    RenderText(pos,label,(char *)0x0,true);
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}